

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

void __thiscall
Fl_PostScript_Graphics_Driver::draw
          (Fl_PostScript_Graphics_Driver *this,Fl_Bitmap *bitmap,int XP,int YP,int WP,int HP,int cx,
          int cy)

{
  ulong uVar1;
  void *data;
  int iVar2;
  Fl_PostScript_Graphics_Driver *this_00;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ulong local_50;
  
  uVar4 = (ulong)(uint)WP;
  iVar6 = (bitmap->super_Fl_Image).w_;
  iVar2 = (iVar6 + 7) / 8;
  uVar3 = iVar6 - cx;
  if ((int)uVar3 < WP) {
    iVar6 = cx / -8 + iVar2;
    local_50 = (ulong)uVar3;
  }
  else {
    iVar6 = cx / -8 + (WP + 7) / 8;
    local_50 = uVar4;
  }
  uVar3 = (bitmap->super_Fl_Image).h_ - cy;
  uVar1 = (ulong)uVar3;
  if (HP <= (int)uVar3) {
    uVar1 = (ulong)(uint)HP;
  }
  pbVar5 = bitmap->array + (cx / 8 + iVar2 * cy);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2a])
            (this,(ulong)(uint)XP,(ulong)(uint)YP,uVar4,(ulong)(uint)HP);
  this_00 = (Fl_PostScript_Graphics_Driver *)this->output;
  iVar2 = 0;
  fprintf((FILE *)this_00,"%i %i %i %i %i %i MI\n",(ulong)(uint)(XP - cx % 8),(ulong)(uint)(YP + HP)
          ,uVar4,(ulong)(uint)-HP,local_50,uVar1);
  data = prepare_rle85(this_00);
  if (iVar6 < 1) {
    iVar6 = iVar2;
  }
  if (HP < 1) {
    HP = iVar2;
  }
  for (; iVar7 = iVar6, iVar2 != HP; iVar2 = iVar2 + 1) {
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      write_rle85(this,""[*pbVar5 & 0xf] << 4 | ""[*pbVar5 >> 4],data);
      pbVar5 = pbVar5 + 1;
    }
  }
  close_rle85(this,data);
  fputc(10,(FILE *)this->output);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])(this);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw(Fl_Bitmap * bitmap,int XP, int YP, int WP, int HP, int cx, int cy){
  const uchar  * di = bitmap->array;
  int w,h;
  int LD=(bitmap->w()+7)/8;
  int xx;

  if (WP> bitmap->w() - cx){// to assure that it does not go out of bounds;
     w = bitmap->w() - cx;
     xx = (bitmap->w()+7)/8 - cx/8; //length of mask in bytes
  }else{
    w =WP;
    xx = (w+7)/8 - cx/8;
  }
  if ( HP > bitmap->h()-cy)
    h = bitmap->h() - cy;
  else
    h = HP;

  di += cy*LD + cx/8;
  int si = cx % 8; // small shift to be clipped, it is simpler than shifting whole mask

  int i,j;
  push_clip(XP, YP, WP, HP);
  fprintf(output , "%i %i %i %i %i %i MI\n", XP - si, YP + HP , WP , -HP , w , h);

  void *rle85 = prepare_rle85();
  for (j=0; j<HP; j++){
    for (i=0; i<xx; i++){
      write_rle85(swap_byte(*di), rle85);
      di++;
    }
  }
  close_rle85(rle85); fputc('\n', output);
  pop_clip();
}